

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall testing::internal::FilePath::FilePath(FilePath *this,string *pathname)

{
  string *in_RSI;
  string *in_RDI;
  FilePath *unaff_retaddr;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  Normalize(unaff_retaddr);
  return;
}

Assistant:

explicit FilePath(const std::string& pathname) : pathname_(pathname) {
    Normalize();
  }